

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O1

void __thiscall
spdlog::sinks::syslog_sink<std::mutex>::syslog_sink
          (syslog_sink<std::mutex> *this,string *ident,int syslog_option,int syslog_facility,
          bool enable_formatting)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  char *__ident;
  
  base_sink<std::mutex>::base_sink(&this->super_base_sink<std::mutex>);
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__syslog_sink_004de5c8;
  this->enable_formatting_ = enable_formatting;
  (this->syslog_levels_)._M_elems[3] = 4;
  (this->syslog_levels_)._M_elems[4] = 3;
  (this->syslog_levels_)._M_elems[5] = 2;
  (this->syslog_levels_)._M_elems[6] = 6;
  (this->syslog_levels_)._M_elems[0] = 7;
  (this->syslog_levels_)._M_elems[1] = 7;
  (this->syslog_levels_)._M_elems[2] = 6;
  (this->syslog_levels_)._M_elems[3] = 4;
  paVar1 = &(this->ident_).field_2;
  (this->ident_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (ident->_M_dataplus)._M_p;
  paVar2 = &ident->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&ident->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ident_).field_2 + 8) = uVar4;
  }
  else {
    (this->ident_)._M_dataplus._M_p = pcVar3;
    (this->ident_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ident_)._M_string_length = ident->_M_string_length;
  (ident->_M_dataplus)._M_p = (pointer)paVar2;
  ident->_M_string_length = 0;
  (ident->field_2)._M_local_buf[0] = '\0';
  __ident = (char *)(this->ident_)._M_string_length;
  if (__ident != (char *)0x0) {
    __ident = (this->ident_)._M_dataplus._M_p;
  }
  openlog(__ident,syslog_option,syslog_facility);
  return;
}

Assistant:

syslog_sink(std::string ident, int syslog_option, int syslog_facility, bool enable_formatting)
        : enable_formatting_{enable_formatting},
          syslog_levels_{{/* spdlog::level::trace      */ LOG_DEBUG,
                          /* spdlog::level::debug      */ LOG_DEBUG,
                          /* spdlog::level::info       */ LOG_INFO,
                          /* spdlog::level::warn       */ LOG_WARNING,
                          /* spdlog::level::err        */ LOG_ERR,
                          /* spdlog::level::critical   */ LOG_CRIT,
                          /* spdlog::level::off        */ LOG_INFO}},
          ident_{std::move(ident)} {
        // set ident to be program name if empty
        ::openlog(ident_.empty() ? nullptr : ident_.c_str(), syslog_option, syslog_facility);
    }